

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>const&>
          (SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *this,pointer pos
          ,basic_string_view<char,_std::char_traits<char>_> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pbVar4;
  long lVar5;
  pointer pbVar6;
  pointer pbVar7;
  iterator __result;
  size_t *in_RDX;
  iterator in_RSI;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::max_size
                    ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     0x3fd68b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::calculateGrowth
                    (in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pbVar4 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::begin(in_RDI);
  lVar5 = (long)__last - (long)pbVar4;
  pbVar6 = (pointer)operator_new(0x3fd6ea);
  pbVar7 = pbVar6 + (lVar5 >> 4);
  pbVar7->_M_len = *in_RDX;
  pbVar7->_M_str = (char *)in_RDX[1];
  pbVar4 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::end(in_RDI);
  if (in_RSI == pbVar4) {
    __result = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                         (in_RDI);
    pbVar4 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::end(in_RDI);
    std::
    uninitialized_move<std::basic_string_view<char,std::char_traits<char>>*,std::basic_string_view<char,std::char_traits<char>>*>
              (in_RSI,__last,__result);
  }
  else {
    SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::begin(in_RDI);
    std::
    uninitialized_move<std::basic_string_view<char,std::char_traits<char>>*,std::basic_string_view<char,std::char_traits<char>>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pbVar4 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::end(in_RDI);
    std::
    uninitialized_move<std::basic_string_view<char,std::char_traits<char>>*,std::basic_string_view<char,std::char_traits<char>>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            (in_RDI,(EVP_PKEY_CTX *)pbVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pbVar6;
  return pbVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}